

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool array_bitset_container_intersect(array_container_t *src_1,bitset_container_t *src_2)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = src_1->cardinality;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while ((src_2->words[src_1->array[uVar4] >> 6] >> ((ulong)src_1->array[uVar4] & 0x3f) & 1) == 0)
  ;
  return (long)uVar4 < (long)(int)uVar1;
}

Assistant:

bool array_bitset_container_intersect(const array_container_t *src_1,
                                         const bitset_container_t *src_2) {
	const int32_t origcard = src_1->cardinality;
	for (int i = 0; i < origcard; ++i) {
	        uint16_t key = src_1->array[i];
	        if(bitset_container_contains(src_2, key)) return true;
	}
	return false;
}